

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *this;
  buffer_appender<char> bVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_38;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_30;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_28;
  buffer_appender<char> it;
  char value_local;
  buffer_appender<char> out_local;
  
  local_30 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._7_1_ = value;
  local_28.container = (buffer<char> *)reserve<char>(out,1);
  local_38 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator++(&local_28,0);
  this = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_38);
  std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
            (this,(value_type *)
                  ((long)&it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  7));
  bVar1 = base_iterator<fmt::v7::detail::buffer_appender<char>>
                    (out,(buffer_appender<char>)local_28.container);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, Char value) {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}